

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O3

int Ivy_ManCheckFanouts(Ivy_Man_t *p)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  Vec_Ptr_t *vArray;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  Ivy_Obj_t *pIVar8;
  int local_34;
  
  if (p->fFanout == 0) {
    return 1;
  }
  vArray = (Vec_Ptr_t *)malloc(0x10);
  vArray->nCap = 100;
  vArray->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vArray->pArray = ppvVar4;
  pVVar5 = p->vObjs;
  if (pVVar5->nSize < 1) {
    local_34 = 1;
  }
  else {
    local_34 = 1;
    lVar7 = 0;
    do {
      puVar1 = (uint *)pVVar5->pArray[lVar7];
      if ((puVar1 != (uint *)0x0) &&
         (pIVar8 = (Ivy_Obj_t *)(*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe),
         pIVar8 != (Ivy_Obj_t *)0x0)) {
        Ivy_ObjCollectFanouts(p,pIVar8,vArray);
        iVar3 = vArray->nSize;
        if ((long)iVar3 < 1) {
          lVar6 = 0;
LAB_007923d9:
          if ((int)lVar6 == iVar3) goto LAB_007923dd;
        }
        else {
          lVar6 = 0;
          do {
            if (((uint *)vArray->pArray[lVar6] == (uint *)0x0) ||
               ((uint *)vArray->pArray[lVar6] == puVar1)) goto LAB_007923d9;
            lVar6 = lVar6 + 1;
          } while (iVar3 != lVar6);
LAB_007923dd:
          local_34 = 0;
          printf("Node %d is a fanin of node %d but the fanout is not there.\n",
                 (ulong)(uint)pIVar8->Id,(ulong)*puVar1);
        }
        pIVar8 = (Ivy_Obj_t *)(*(ulong *)(puVar1 + 6) & 0xfffffffffffffffe);
        if (pIVar8 != (Ivy_Obj_t *)0x0) {
          Ivy_ObjCollectFanouts(p,pIVar8,vArray);
          iVar3 = vArray->nSize;
          if ((long)iVar3 < 1) {
            lVar6 = 0;
LAB_0079243b:
            if ((int)lVar6 == iVar3) goto LAB_0079243f;
          }
          else {
            lVar6 = 0;
            do {
              if (((uint *)vArray->pArray[lVar6] == (uint *)0x0) ||
                 ((uint *)vArray->pArray[lVar6] == puVar1)) goto LAB_0079243b;
              lVar6 = lVar6 + 1;
            } while (iVar3 != lVar6);
LAB_0079243f:
            local_34 = 0;
            printf("Node %d is a fanin of node %d but the fanout is not there.\n",
                   (ulong)(uint)pIVar8->Id,(ulong)*puVar1);
          }
          puVar2 = *(uint **)(puVar1 + 0xe);
          if (puVar2 != (uint *)0x0) {
            if (((((*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe) !=
                   (*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe)) &&
                 ((*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe) !=
                  (*(ulong *)(puVar1 + 6) & 0xfffffffffffffffe))) &&
                ((*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe))) &&
               ((*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe) !=
                (*(ulong *)(puVar1 + 6) & 0xfffffffffffffffe))) {
              local_34 = 0;
              printf("Node %d has prev %d without common fanin.\n",(ulong)*puVar1,(ulong)*puVar2);
            }
          }
          puVar2 = *(uint **)(puVar1 + 0x10);
          if (puVar2 != (uint *)0x0) {
            if ((((*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe) !=
                  (*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe)) &&
                ((*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar1 + 6) & 0xfffffffffffffffe))) &&
               (((*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe) &&
                ((*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar1 + 6) & 0xfffffffffffffffe))))) {
              local_34 = 0;
              printf("Node %d has prev %d without common fanin.\n",(ulong)*puVar1,(ulong)*puVar2);
            }
          }
        }
      }
      lVar7 = lVar7 + 1;
      pVVar5 = p->vObjs;
    } while (lVar7 < pVVar5->nSize);
    if (0 < pVVar5->nSize) {
      lVar7 = 0;
      do {
        pIVar8 = (Ivy_Obj_t *)pVVar5->pArray[lVar7];
        if (pIVar8 != (Ivy_Obj_t *)0x0) {
          Ivy_ObjCollectFanouts(p,pIVar8,vArray);
          iVar3 = vArray->nSize;
          if (0 < iVar3) {
            lVar6 = 0;
            do {
              puVar1 = (uint *)vArray->pArray[lVar6];
              if (puVar1 == (uint *)0x0) break;
              if ((pIVar8 != (Ivy_Obj_t *)(*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe)) &&
                 (pIVar8 != (Ivy_Obj_t *)(*(ulong *)(puVar1 + 6) & 0xfffffffffffffffe))) {
                local_34 = 0;
                printf("Node %d is a fanout of node %d but the fanin is not there.\n",(ulong)*puVar1
                       ,(ulong)(uint)pIVar8->Id);
                iVar3 = vArray->nSize;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < iVar3);
          }
        }
        lVar7 = lVar7 + 1;
        pVVar5 = p->vObjs;
      } while (lVar7 < pVVar5->nSize);
    }
  }
  if (vArray->pArray != (void **)0x0) {
    free(vArray->pArray);
  }
  free(vArray);
  return local_34;
}

Assistant:

int Ivy_ManCheckFanouts( Ivy_Man_t * p )
{
    Vec_Ptr_t * vFanouts;
    Ivy_Obj_t * pObj, * pFanout, * pFanin;
    int i, k, RetValue = 1;
    if ( !p->fFanout )
        return 1;
    vFanouts = Vec_PtrAlloc( 100 );
    // make sure every fanin is a fanout
    Ivy_ManForEachObj( p, pObj, i )
    {
        pFanin = Ivy_ObjFanin0(pObj);
        if ( pFanin == NULL )
            continue;
        Ivy_ObjForEachFanout( p, pFanin, vFanouts, pFanout, k )
            if ( pFanout == pObj )
                break;
        if ( k == Vec_PtrSize(vFanouts) )
        {
            printf( "Node %d is a fanin of node %d but the fanout is not there.\n", pFanin->Id, pObj->Id );
            RetValue = 0;
        }

        pFanin = Ivy_ObjFanin1(pObj);
        if ( pFanin == NULL )
            continue;
        Ivy_ObjForEachFanout( p, pFanin, vFanouts, pFanout, k )
            if ( pFanout == pObj )
                break;
        if ( k == Vec_PtrSize(vFanouts) )
        {
            printf( "Node %d is a fanin of node %d but the fanout is not there.\n", pFanin->Id, pObj->Id );
            RetValue = 0;
        }
        // check that the previous fanout has the same fanin
        if ( pObj->pPrevFan0 )
        {
            if ( Ivy_ObjFanin0(pObj->pPrevFan0) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin0(pObj->pPrevFan0) != Ivy_ObjFanin1(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan0) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan0) != Ivy_ObjFanin1(pObj) )
            {
                printf( "Node %d has prev %d without common fanin.\n", pObj->Id, pObj->pPrevFan0->Id );
                RetValue = 0;
            }
        }
        // check that the previous fanout has the same fanin
        if ( pObj->pPrevFan1 )
        {
            if ( Ivy_ObjFanin0(pObj->pPrevFan1) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin0(pObj->pPrevFan1) != Ivy_ObjFanin1(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan1) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan1) != Ivy_ObjFanin1(pObj) )
            {
                printf( "Node %d has prev %d without common fanin.\n", pObj->Id, pObj->pPrevFan1->Id );
                RetValue = 0;
            }
        }
    }
    // make sure every fanout is a fanin
    Ivy_ManForEachObj( p, pObj, i )
    {
        Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, k )
            if ( Ivy_ObjFanin0(pFanout) != pObj && Ivy_ObjFanin1(pFanout) != pObj )
            {
                printf( "Node %d is a fanout of node %d but the fanin is not there.\n", pFanout->Id, pObj->Id );
                RetValue = 0;
            }
    }
    Vec_PtrFree( vFanouts );
    return RetValue;
}